

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void scalarFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Fts3Hash *pH;
  void *data;
  int iVar1;
  int iVar2;
  void *in_RAX;
  void *pvVar3;
  undefined8 *puVar4;
  Fts3HashElem *pFVar5;
  char *pcVar6;
  Mem *pMem;
  void *local_38;
  
  pH = (Fts3Hash *)context->pFunc->pUserData;
  local_38 = in_RAX;
  pvVar3 = sqlite3ValueText(*argv,'\x01');
  iVar1 = sqlite3ValueBytes(*argv,'\x01');
  if (argc != 2) {
    if (pvVar3 != (void *)0x0) {
      pFVar5 = sqlite3Fts3HashFindElem(pH,pvVar3,iVar1 + 1);
      if ((pFVar5 != (Fts3HashElem *)0x0) && (local_38 = pFVar5->data, local_38 != (void *)0x0))
      goto LAB_00178a20;
    }
    pcVar6 = sqlite3_mprintf("unknown tokenizer: %s",pvVar3);
    context->isError = 1;
    context->fErrorOrAux = '\x01';
    sqlite3VdbeMemSetStr(context->pOut,pcVar6,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
    sqlite3_free(pcVar6);
    return;
  }
  iVar2 = sqlite3ValueBytes(argv[1],'\x01');
  if ((pvVar3 == (void *)0x0) || (iVar2 != 8)) {
    context->isError = 1;
    context->fErrorOrAux = '\x01';
    pMem = context->pOut;
    pcVar6 = "argument type mismatch";
  }
  else {
    puVar4 = (undefined8 *)sqlite3_value_blob(argv[1]);
    data = (void *)*puVar4;
    local_38 = data;
    pvVar3 = sqlite3Fts3HashInsert(pH,pvVar3,iVar1 + 1,data);
    if (pvVar3 != data) {
LAB_00178a20:
      setResultStrOrError(context,(char *)&local_38,8,'\0',(_func_void_void_ptr *)0xffffffffffffffff
                         );
      return;
    }
    context->isError = 1;
    context->fErrorOrAux = '\x01';
    pMem = context->pOut;
    pcVar6 = "out of memory";
  }
  sqlite3VdbeMemSetStr(pMem,pcVar6,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  return;
}

Assistant:

static void scalarFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  Fts3Hash *pHash;
  void *pPtr = 0;
  const unsigned char *zName;
  int nName;

  assert( argc==1 || argc==2 );

  pHash = (Fts3Hash *)sqlite3_user_data(context);

  zName = sqlite3_value_text(argv[0]);
  nName = sqlite3_value_bytes(argv[0])+1;

  if( argc==2 ){
    void *pOld;
    int n = sqlite3_value_bytes(argv[1]);
    if( zName==0 || n!=sizeof(pPtr) ){
      sqlite3_result_error(context, "argument type mismatch", -1);
      return;
    }
    pPtr = *(void **)sqlite3_value_blob(argv[1]);
    pOld = sqlite3Fts3HashInsert(pHash, (void *)zName, nName, pPtr);
    if( pOld==pPtr ){
      sqlite3_result_error(context, "out of memory", -1);
      return;
    }
  }else{
    if( zName ){
      pPtr = sqlite3Fts3HashFind(pHash, zName, nName);
    }
    if( !pPtr ){
      char *zErr = sqlite3_mprintf("unknown tokenizer: %s", zName);
      sqlite3_result_error(context, zErr, -1);
      sqlite3_free(zErr);
      return;
    }
  }

  sqlite3_result_blob(context, (void *)&pPtr, sizeof(pPtr), SQLITE_TRANSIENT);
}